

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

char * baseFilename(char *filename)

{
  size_t sVar1;
  bool bVar2;
  char *local_20;
  char *cur;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(filename);
    local_20 = filename + sVar1;
    while( true ) {
      bVar2 = false;
      if (filename < local_20) {
        bVar2 = *local_20 != '/';
      }
      if (!bVar2) break;
      local_20 = local_20 + -1;
    }
    if (*local_20 == '/') {
      filename_local = local_20 + 1;
    }
    else {
      filename_local = local_20;
    }
  }
  return filename_local;
}

Assistant:

static const char *baseFilename(const char *filename) {
    const char *cur;
    if (filename == NULL)
        return(NULL);
    cur = &filename[strlen(filename)];
    while ((cur > filename) && (*cur != '/'))
        cur--;
    if (*cur == '/')
        return(cur + 1);
    return(cur);
}